

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushID(int int_id)

{
  ImVector<unsigned_int> *this;
  ImGuiID local_24;
  ImGuiWindow *local_20;
  ImGuiWindow *window;
  void *ptr_id;
  int int_id_local;
  
  window = (ImGuiWindow *)(long)int_id;
  ptr_id._4_4_ = int_id;
  local_20 = GetCurrentWindow();
  this = &local_20->IDStack;
  local_24 = ImGuiWindow::GetID(local_20,window);
  ImVector<unsigned_int>::push_back(this,&local_24);
  return;
}

Assistant:

void ImGui::PushID(int int_id)
{
    const void* ptr_id = (void*)(intptr_t)int_id;
    ImGuiWindow* window = GetCurrentWindow();
    window->IDStack.push_back(window->GetID(ptr_id));
}